

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall
AI::HierarchicalTaskNetworkComponent::updateHUD_PlanPath(HierarchicalTaskNetworkComponent *this)

{
  ulong uVar1;
  size_t this_00;
  World *this_01;
  GameMode *this_02;
  size_type sVar2;
  reference __k;
  char *pcVar3;
  reference pvVar4;
  difference_type dVar5;
  __normal_iterator<AI::TaskIdentifier_*,_std::vector<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>_>
  local_30;
  __normal_iterator<AI::TaskIdentifier_*,_std::vector<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>_>
  local_28;
  ulong local_20;
  size_t i;
  TaskDatabase *tasks;
  HierarchicalTaskNetworkComponent *this_local;
  
  tasks = (TaskDatabase *)this;
  this_01 = Component::getWorld(&this->super_Component);
  this_02 = World::getAuthGameMode(this_01);
  i = (size_t)GameMode::getAvailableTasks(this_02);
  for (local_20 = 0; uVar1 = local_20, local_20 < 5; local_20 = local_20 + 1) {
    sVar2 = std::vector<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>::size
                      (&(this->planner).plan.planPath);
    this_00 = i;
    if (uVar1 < sVar2) {
      __k = std::vector<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>::operator[]
                      (&(this->planner).plan.planPath,local_20);
      std::
      map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
      ::operator[]((map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
                    *)this_00,__k);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->planPath,local_20);
      std::__cxx11::string::operator=((string *)pvVar4,pcVar3);
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->planPath,local_20);
      std::__cxx11::string::operator=((string *)pvVar4,"");
    }
  }
  local_28 = __gnu_cxx::operator+(1,&(this->planner).plan.currentPathVertex);
  local_30._M_current =
       (TaskIdentifier *)
       std::begin<std::vector<AI::TaskIdentifier,std::allocator<AI::TaskIdentifier>>>
                 (&(this->planner).plan.planPath);
  dVar5 = __gnu_cxx::operator-(&local_28,&local_30);
  this->planProgress = (float)dVar5 / 5.0;
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::updateHUD_PlanPath()
{
	auto& tasks = getWorld()->getAuthGameMode()->getAvailableTasks();

	for (std::size_t i = 0; i < 5u; i++)
	{
		if (i < planner.plan.planPath.size())
		{
			planPath[i] = tasks.tasks[planner.plan.planPath[i]].debugName.c_str(); 
		}
		else
		{
			planPath[i] = "";
		}
	}

	planProgress = (1 + planner.plan.currentPathVertex - begin(planner.plan.planPath)) / 5.f;
}